

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O2

crypto_word_t
abi_test::internal::
CheckImpl<void,unsigned_char*,unsigned_char_const*,unsigned_long,unsigned_char_const*,unsigned_long,chacha20_poly1305_seal_data*>
          (Result *out,bool unwind,
          _func_void_uchar_ptr_uchar_ptr_unsigned_long_uchar_ptr_unsigned_long_chacha20_poly1305_seal_data_ptr
          *func,Type args,Type args_1,Type_conflict args_2,Type args_3,Type_conflict args_4,
          Type args_5)

{
  crypto_word_t cVar1;
  crypto_word_t argv [7];
  
  argv[3] = (crypto_word_t)args_3;
  argv[4] = args_4;
  argv[5] = (crypto_word_t)args_5;
  argv[6] = 0;
  argv[0] = (crypto_word_t)args;
  argv[1] = (crypto_word_t)args_1;
  argv[2] = args_2;
  cVar1 = RunTrampoline(out,(crypto_word_t)func,argv,6,unwind);
  return cVar1;
}

Assistant:

inline crypto_word_t CheckImpl(Result *out, bool unwind, R (*func)(Args...),
                               typename DeductionGuard<Args>::Type... args) {
  // We only support up to 8 arguments, so all arguments on aarch64 are passed
  // in registers. This is simpler and avoids the iOS discrepancy around packing
  // small arguments on the stack. (See the iOS64 reference.)
  static_assert(sizeof...(args) <= 8,
                "too many arguments for abi_test_trampoline");

  // Allocate one extra entry so MSVC does not complain about zero-size arrays.
  crypto_word_t argv[sizeof...(args) + 1] = {
      ToWord(args)...,
  };
  return RunTrampoline(out, reinterpret_cast<crypto_word_t>(func), argv,
                       sizeof...(args), unwind);
}